

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_16549e0::LowBDConvolveScaleTest::SetUp(LowBDConvolveScaleTest *this)

{
  __tuple_element_t<0UL,_tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_tuple<int,_int>_>_>
  *pp_Var1;
  long in_RDI;
  int bd;
  BlockDimension *block;
  BaseParams *in_stack_00000038;
  ConvolveScaleTestBase<unsigned_char> *in_stack_00000040;
  _Tuple_impl<0UL,_int,_int> local_24;
  BaseParams local_1c;
  undefined4 local_14;
  _Tuple_impl<0UL,_int,_int> *local_10;
  
  testing::
  WithParamInterface<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
  ::GetParam();
  pp_Var1 = std::
            get<0ul,void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,InterpFilterParams_const*,InterpFilterParams_const*,int,int,int,int,ConvolveParams*),std::tuple<int,int>>
                      ((tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>
                        *)0xd7a060);
  *(__tuple_element_t<0UL,_tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_tuple<int,_int>_>_>
    *)(in_RDI + 0x78) = *pp_Var1;
  testing::
  WithParamInterface<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
  ::GetParam();
  local_10 = &std::
              get<1ul,void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,InterpFilterParams_const*,InterpFilterParams_const*,int,int,int,int,ConvolveParams*),std::tuple<int,int>>
                        ((tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>
                          *)0xd7a07c)->super__Tuple_impl<0UL,_int,_int>;
  local_14 = 8;
  local_24 = *local_10;
  BaseParams::BaseParams(&local_1c,(BlockDimension *)&local_24);
  ConvolveScaleTestBase<unsigned_char>::SetParams(in_stack_00000040,in_stack_00000038,this._4_4_);
  return;
}

Assistant:

void SetUp() override {
    tst_fun_ = GET_PARAM(0);

    const BlockDimension &block = GET_PARAM(1);
    const int bd = 8;

    SetParams(BaseParams(block), bd);
  }